

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# easylogging++.cc
# Opt level: O0

unsigned_long __thiscall
el::base::TypedConfigurations::getULong(TypedConfigurations *this,string *confVal)

{
  uint uVar1;
  ostream *poVar2;
  char *__nptr;
  bool local_209;
  string local_208 [48];
  stringstream local_1d8 [8];
  stringstream internalInfoStream;
  ostream local_1c8 [376];
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_50 [2];
  undefined8 local_40;
  undefined8 local_38;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_30;
  bool local_21;
  string *psStack_20;
  bool valid;
  string *confVal_local;
  TypedConfigurations *this_local;
  
  local_21 = true;
  psStack_20 = confVal;
  confVal_local = (string *)this;
  utils::Str::trim(confVal);
  uVar1 = std::__cxx11::string::empty();
  local_209 = false;
  if ((uVar1 & 1) == 0) {
    local_38 = std::__cxx11::string::begin();
    local_40 = std::__cxx11::string::end();
    local_30 = std::
               find_if<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,el::base::TypedConfigurations::getULong(std::__cxx11::string)::__0>
                         (local_38,local_40);
    local_50[0]._M_current = (char *)std::__cxx11::string::end();
    local_209 = __gnu_cxx::operator==(&local_30,local_50);
  }
  local_21 = local_209;
  if (local_209 == false) {
    local_21 = false;
    std::__cxx11::stringstream::stringstream(local_1d8);
    poVar2 = std::operator<<(local_1c8,"Configuration value not a valid integer [");
    poVar2 = std::operator<<(poVar2,(string *)confVal);
    std::operator<<(poVar2,"]");
    poVar2 = std::operator<<((ostream *)&std::cerr,"ASSERTION FAILURE FROM EASYLOGGING++ (LINE: ");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,0x67a);
    poVar2 = std::operator<<(poVar2,") [valid");
    poVar2 = std::operator<<(poVar2,"] WITH MESSAGE \"");
    std::__cxx11::stringstream::str();
    poVar2 = std::operator<<(poVar2,local_208);
    poVar2 = std::operator<<(poVar2,"\"");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    std::__cxx11::string::~string(local_208);
    std::__cxx11::stringstream::~stringstream(local_1d8);
    this_local = (TypedConfigurations *)0x0;
  }
  else {
    __nptr = (char *)std::__cxx11::string::c_str();
    this_local = (TypedConfigurations *)atol(__nptr);
  }
  return (unsigned_long)this_local;
}

Assistant:

unsigned long TypedConfigurations::getULong(std::string confVal) {
  bool valid = true;
  base::utils::Str::trim(confVal);
  valid = !confVal.empty() && std::find_if(confVal.begin(), confVal.end(),
  [](char c) {
    return !base::utils::Str::isDigit(c);
  }) == confVal.end();
  if (!valid) {
    valid = false;
    ELPP_ASSERT(valid, "Configuration value not a valid integer [" << confVal << "]");
    return 0;
  }
  return atol(confVal.c_str());
}